

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 aVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  BVH *bvh;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  size_t k;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined8 unaff_RBX;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar17 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar20 [64];
  float fVar21;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar22 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  vfloat4 a0;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  Precalculations pre;
  TravRayK<8,_true> tray;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_3c0;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined1 auStack_380 [352];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_220;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    aVar1 = valid_i->field_0;
    auVar5 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    auVar5 = vpcmpeqd_avx2((undefined1  [32])aVar1,auVar5);
    iVar9 = vmovmskps_avx(auVar5);
    uVar10 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),iVar9);
    if (iVar9 != 0) {
      auVar5 = *(undefined1 (*) [32])(ray + 0x80);
      auVar2 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar3 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar20._0_4_ = auVar3._0_4_ * auVar3._0_4_;
      auVar20._4_4_ = auVar3._4_4_ * auVar3._4_4_;
      auVar20._8_4_ = auVar3._8_4_ * auVar3._8_4_;
      auVar20._12_4_ = auVar3._12_4_ * auVar3._12_4_;
      auVar20._16_4_ = auVar3._16_4_ * auVar3._16_4_;
      auVar20._20_4_ = auVar3._20_4_ * auVar3._20_4_;
      auVar20._28_36_ = in_ZMM4._28_36_;
      auVar20._24_4_ = auVar3._24_4_ * auVar3._24_4_;
      auVar22 = vfmadd231ps_fma(auVar20._0_32_,auVar2,auVar2);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar5,auVar5);
      auVar4 = vrsqrtps_avx(ZEXT1632(auVar22));
      fVar21 = auVar4._0_4_;
      fVar27 = auVar4._4_4_;
      fVar28 = auVar4._8_4_;
      fVar29 = auVar4._12_4_;
      fVar30 = auVar4._16_4_;
      fVar31 = auVar4._20_4_;
      fVar32 = auVar4._24_4_;
      auVar34._8_4_ = 0x3fc00000;
      auVar34._0_8_ = 0x3fc000003fc00000;
      auVar34._12_4_ = 0x3fc00000;
      auVar34._16_4_ = 0x3fc00000;
      auVar34._20_4_ = 0x3fc00000;
      auVar34._24_4_ = 0x3fc00000;
      auVar34._28_4_ = 0x3fc00000;
      auVar19._4_4_ = fVar27 * fVar27 * fVar27 * auVar22._4_4_ * -0.5;
      auVar19._0_4_ = fVar21 * fVar21 * fVar21 * auVar22._0_4_ * -0.5;
      auVar19._8_4_ = fVar28 * fVar28 * fVar28 * auVar22._8_4_ * -0.5;
      auVar19._12_4_ = fVar29 * fVar29 * fVar29 * auVar22._12_4_ * -0.5;
      auVar19._16_4_ = fVar30 * fVar30 * fVar30 * -0.0;
      auVar19._20_4_ = fVar31 * fVar31 * fVar31 * -0.0;
      auVar19._24_4_ = fVar32 * fVar32 * fVar32 * -0.0;
      auVar19._28_4_ = 0;
      auVar22 = vfmadd213ps_fma(auVar34,auVar4,auVar19);
      local_3c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar22);
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar22._12_4_ = 0;
      auVar22._0_12_ = ZEXT812(0);
      auVar22 = auVar22 << 0x20;
      uVar7 = uVar10;
      do {
        lVar8 = 0;
        for (uVar11 = uVar7; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar8 = lVar8 + 1;
        }
        uVar11 = (ulong)(uint)((int)lVar8 * 4);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar11 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar11 + 0xa0)),0x1c);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + uVar11 + 0xc0)),0x28);
        fVar21 = *(float *)((long)&local_3c0 + uVar11);
        auVar36._0_4_ = auVar35._0_4_ * fVar21;
        auVar36._4_4_ = auVar35._4_4_ * fVar21;
        auVar36._8_4_ = auVar35._8_4_ * fVar21;
        auVar36._12_4_ = auVar35._12_4_ * fVar21;
        auVar39 = vshufpd_avx(auVar36,auVar36,1);
        auVar35 = vmovshdup_avx(auVar36);
        auVar38 = vunpckhps_avx(auVar36,auVar22);
        auVar37._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
        auVar37._8_8_ = auVar39._8_8_ ^ auVar17._8_8_;
        auVar37 = vinsertps_avx(auVar37,auVar36,0x2a);
        auVar38 = vshufps_avx(auVar38,ZEXT416(auVar35._0_4_ ^ 0x80000000),0x41);
        auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
        auVar39 = vdpps_avx(auVar38,auVar38,0x7f);
        auVar35 = vcmpps_avx(auVar35,auVar39,1);
        auVar40._0_4_ = auVar35._0_4_;
        auVar40._4_4_ = auVar40._0_4_;
        auVar40._8_4_ = auVar40._0_4_;
        auVar40._12_4_ = auVar40._0_4_;
        auVar35 = vblendvps_avx(auVar37,auVar38,auVar40);
        auVar39 = vdpps_avx(auVar35,auVar35,0x7f);
        auVar37 = vrsqrtss_avx(auVar39,auVar39);
        fVar27 = auVar37._0_4_;
        fVar27 = fVar27 * 1.5 - auVar39._0_4_ * 0.5 * fVar27 * fVar27 * fVar27;
        auVar38._0_4_ = auVar35._0_4_ * fVar27;
        auVar38._4_4_ = auVar35._4_4_ * fVar27;
        auVar38._8_4_ = auVar35._8_4_ * fVar27;
        auVar38._12_4_ = auVar35._12_4_ * fVar27;
        auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
        auVar39 = vshufps_avx(auVar36,auVar36,0xc9);
        auVar41._0_4_ = auVar38._0_4_ * auVar39._0_4_;
        auVar41._4_4_ = auVar38._4_4_ * auVar39._4_4_;
        auVar41._8_4_ = auVar38._8_4_ * auVar39._8_4_;
        auVar41._12_4_ = auVar38._12_4_ * auVar39._12_4_;
        auVar35 = vfmsub231ps_fma(auVar41,auVar36,auVar35);
        auVar37 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
        lVar8 = lVar8 * 0x30;
        auVar39 = vrsqrtss_avx(auVar35,auVar35);
        fVar27 = auVar39._0_4_;
        fVar27 = fVar27 * 1.5 - auVar35._0_4_ * 0.5 * fVar27 * fVar27 * fVar27;
        uVar7 = uVar7 - 1 & uVar7;
        auVar39._0_4_ = fVar27 * auVar37._0_4_;
        auVar39._4_4_ = fVar27 * auVar37._4_4_;
        auVar39._8_4_ = fVar27 * auVar37._8_4_;
        auVar39._12_4_ = fVar27 * auVar37._12_4_;
        auVar35._0_4_ = fVar21 * auVar36._0_4_;
        auVar35._4_4_ = fVar21 * auVar36._4_4_;
        auVar35._8_4_ = fVar21 * auVar36._8_4_;
        auVar35._12_4_ = fVar21 * auVar36._12_4_;
        auVar37 = vunpcklps_avx(auVar38,auVar35);
        auVar35 = vunpckhps_avx(auVar38,auVar35);
        auVar38 = vunpcklps_avx(auVar39,auVar22);
        auVar39 = vunpckhps_avx(auVar39,auVar22);
        auVar39 = vunpcklps_avx(auVar35,auVar39);
        auVar36 = vunpcklps_avx(auVar37,auVar38);
        auVar35 = vunpckhps_avx(auVar37,auVar38);
        *(undefined1 (*) [16])(local_3a0 + lVar8) = auVar36;
        *(undefined1 (*) [16])(auStack_390 + lVar8) = auVar35;
        *(undefined1 (*) [16])(auStack_380 + lVar8) = auVar39;
      } while (uVar7 != 0);
      auVar4 = vpcmpeqd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar17));
      auVar6 = vpcmpeqd_avx2((undefined1  [32])aVar1,auVar4);
      local_220._0_8_ = *(undefined8 *)ray;
      local_220._8_8_ = *(undefined8 *)(ray + 8);
      local_220._16_8_ = *(undefined8 *)(ray + 0x10);
      local_220._24_8_ = *(undefined8 *)(ray + 0x18);
      local_220._32_8_ = *(undefined8 *)(ray + 0x20);
      local_220._40_8_ = *(undefined8 *)(ray + 0x28);
      local_220._48_8_ = *(undefined8 *)(ray + 0x30);
      local_220._56_8_ = *(undefined8 *)(ray + 0x38);
      local_220._64_8_ = *(undefined8 *)(ray + 0x40);
      local_220._72_8_ = *(undefined8 *)(ray + 0x48);
      local_220._80_8_ = *(undefined8 *)(ray + 0x50);
      local_220._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18._16_4_ = 0x7fffffff;
      auVar18._20_4_ = 0x7fffffff;
      auVar18._24_4_ = 0x7fffffff;
      auVar18._28_4_ = 0x7fffffff;
      auVar23._8_4_ = 0x219392ef;
      auVar23._0_8_ = 0x219392ef219392ef;
      auVar23._12_4_ = 0x219392ef;
      auVar23._16_4_ = 0x219392ef;
      auVar23._20_4_ = 0x219392ef;
      auVar23._24_4_ = 0x219392ef;
      auVar23._28_4_ = 0x219392ef;
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = &DAT_3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar33._16_4_ = 0x3f800000;
      auVar33._20_4_ = 0x3f800000;
      auVar33._24_4_ = 0x3f800000;
      auVar33._28_4_ = 0x3f800000;
      auVar12 = vdivps_avx(auVar33,auVar5);
      auVar4 = vandps_avx(auVar5,auVar18);
      auVar19 = vcmpps_avx(auVar4,auVar23,1);
      auVar4 = vandps_avx(auVar2,auVar18);
      auVar34 = vcmpps_avx(auVar4,auVar23,1);
      auVar13 = vdivps_avx(auVar33,auVar2);
      auVar4 = vandps_avx(auVar3,auVar18);
      auVar4 = vcmpps_avx(auVar4,auVar23,1);
      auVar14 = vdivps_avx(auVar33,auVar3);
      auVar24._8_4_ = 0x5d5e0b6b;
      auVar24._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar24._12_4_ = 0x5d5e0b6b;
      auVar24._16_4_ = 0x5d5e0b6b;
      auVar24._20_4_ = 0x5d5e0b6b;
      auVar24._24_4_ = 0x5d5e0b6b;
      auVar24._28_4_ = 0x5d5e0b6b;
      local_160 = vblendvps_avx(auVar12,auVar24,auVar19);
      local_140 = vblendvps_avx(auVar13,auVar24,auVar34);
      local_120 = vblendvps_avx(auVar14,auVar24,auVar4);
      auVar4 = vcmpps_avx(local_160,ZEXT832(0) << 0x20,1);
      auVar25._8_4_ = 0x10;
      auVar25._0_8_ = 0x1000000010;
      auVar25._12_4_ = 0x10;
      auVar25._16_4_ = 0x10;
      auVar25._20_4_ = 0x10;
      auVar25._24_4_ = 0x10;
      auVar25._28_4_ = 0x10;
      local_100 = vandps_avx(auVar4,auVar25);
      auVar4 = vcmpps_avx(local_140,ZEXT832(0) << 0x20,5);
      auVar14._8_4_ = 0x20;
      auVar14._0_8_ = 0x2000000020;
      auVar14._12_4_ = 0x20;
      auVar14._16_4_ = 0x20;
      auVar14._20_4_ = 0x20;
      auVar14._24_4_ = 0x20;
      auVar14._28_4_ = 0x20;
      auVar26._8_4_ = 0x30;
      auVar26._0_8_ = 0x3000000030;
      auVar26._12_4_ = 0x30;
      auVar26._16_4_ = 0x30;
      auVar26._20_4_ = 0x30;
      auVar26._24_4_ = 0x30;
      auVar26._28_4_ = 0x30;
      local_e0 = vblendvps_avx(auVar26,auVar14,auVar4);
      auVar19 = ZEXT832(0) << 0x20;
      auVar4 = vcmpps_avx(local_120,auVar19,5);
      auVar13._8_4_ = 0x40;
      auVar13._0_8_ = 0x4000000040;
      auVar13._12_4_ = 0x40;
      auVar13._16_4_ = 0x40;
      auVar13._20_4_ = 0x40;
      auVar13._24_4_ = 0x40;
      auVar13._28_4_ = 0x40;
      auVar15._8_4_ = 0x50;
      auVar15._0_8_ = 0x5000000050;
      auVar15._12_4_ = 0x50;
      auVar15._16_4_ = 0x50;
      auVar15._20_4_ = 0x50;
      auVar15._24_4_ = 0x50;
      auVar15._28_4_ = 0x50;
      local_c0 = vblendvps_avx(auVar15,auVar13,auVar4);
      auVar4 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar19);
      auVar16._8_4_ = 0x7f800000;
      auVar16._0_8_ = 0x7f8000007f800000;
      auVar16._12_4_ = 0x7f800000;
      auVar16._16_4_ = 0x7f800000;
      auVar16._20_4_ = 0x7f800000;
      auVar16._24_4_ = 0x7f800000;
      auVar16._28_4_ = 0x7f800000;
      local_a0 = vblendvps_avx(auVar16,auVar4,auVar6);
      auVar4 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar19);
      auVar12._8_4_ = 0xff800000;
      auVar12._0_8_ = 0xff800000ff800000;
      auVar12._12_4_ = 0xff800000;
      auVar12._16_4_ = 0xff800000;
      auVar12._20_4_ = 0xff800000;
      auVar12._24_4_ = 0xff800000;
      auVar12._28_4_ = 0xff800000;
      local_80 = vblendvps_avx(auVar12,auVar4,auVar6);
      local_1c0 = auVar5;
      local_1a0 = auVar2;
      local_180 = auVar3;
      do {
        k = 0;
        for (uVar7 = uVar10; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
          k = k + 1;
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,(Precalculations *)&local_3c0,ray,
                   (TravRayK<8,_true> *)&local_220.field_0,context);
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }